

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall
chrono::ChMatterSPH::IntLoadResidual_F(ChMatterSPH *this,uint off,ChVectorDynamic<> *R,double c)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  double *pdVar4;
  bool bVar5;
  undefined8 uVar6;
  double dVar7;
  ChProximityContainerSPH *this_01;
  pointer psVar8;
  Index index;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer psVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  uint uVar13;
  ulong uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  double dVar16;
  ChVector<double> TotForce;
  double local_68 [4];
  pointer local_48;
  double local_40;
  ChVectorDynamic<> *local_38;
  
  pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar12 = (pCVar1->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pCVar1->assembly).otherphysicslist.
             super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = c;
  local_38 = R;
  if (psVar12 == local_48) {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (ChProximityContainerSPH *)0x0;
  }
  else {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      peVar2 = (psVar12->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar12->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar2 == (element_type *)0x0) {
        this_01 = (ChProximityContainerSPH *)0x0;
      }
      else {
        this_01 = (ChProximityContainerSPH *)
                  __dynamic_cast(peVar2,&ChPhysicsItem::typeinfo,&ChProximityContainerSPH::typeinfo,
                                 0);
      }
      this_02 = this_00;
      if (this_01 == (ChProximityContainerSPH *)0x0) {
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (this_01 != (ChProximityContainerSPH *)0x0 &&
          this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          this_02 = this_00;
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
          this_02 = this_00;
        }
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    } while ((this_01 == (ChProximityContainerSPH *)0x0) &&
            (psVar12 = psVar12 + 1, p_Var15 = this_02, psVar12 != local_48));
  }
  dVar7 = DAT_00b90ac8;
  dVar16 = DAT_00b90ac0;
  uVar6 = VNULL;
  if (this_01 == (ChProximityContainerSPH *)0x0) {
    __assert_fail("edges",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                  ,0x177,
                  "virtual void chrono::ChMatterSPH::IntLoadResidual_F(const unsigned int, ChVectorDynamic<> &, const double)"
                 );
  }
  psVar8 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->nodes).
                super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8;
  if (lVar9 != 0) {
    uVar13 = 1;
    do {
      peVar3 = (psVar8->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar3 != (element_type *)Q_ROTATE_X_TO_Z) {
        (peVar3->UserForce).m_data[0] = (double)uVar6;
        *(double *)((long)&peVar3->UserForce + 8) = dVar16;
        *(double *)((long)&peVar3->UserForce + 0x10) = dVar7;
      }
      peVar3->density = 0.0;
      uVar10 = (ulong)uVar13;
      psVar8 = psVar8 + 1;
      uVar13 = uVar13 + 1;
    } while (uVar10 < (ulong)(lVar9 >> 4));
  }
  ChProximityContainerSPH::AccumulateStep1(this_01);
  psVar8 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    uVar10 = 0;
    uVar14 = 1;
    do {
      peVar3 = psVar8[uVar10].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var15 = psVar8[uVar10].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      if (peVar3 == (element_type *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                      ,0x18a,
                      "virtual void chrono::ChMatterSPH::IntLoadResidual_F(const unsigned int, ChVectorDynamic<> &, const double)"
                     );
      }
      dVar16 = 0.0;
      if ((peVar3->density != 0.0) || (NAN(peVar3->density))) {
        dVar16 = (double)(**(code **)((long)(peVar3->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))
                                   (peVar3);
        dVar16 = dVar16 / peVar3->density;
      }
      peVar3->volume = dVar16;
      peVar3->pressure =
           (peVar3->density - (this->material).super_ChContinuumMaterial.density) *
           (this->material).pressure_stiffness;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = uVar14 < (ulong)((long)(this->nodes).
                                     super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4)
      ;
      uVar10 = uVar14;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (bVar5);
  }
  ChProximityContainerSPH::AccumulateStep2(this_01);
  psVar8 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    uVar10 = 0;
    uVar13 = off;
    do {
      pCVar1 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
      dVar16 = (double)(**(code **)((long)((psVar8[uVar10].
                                            super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))()
      ;
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = psVar8[uVar10].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_68[0] = dVar16 * (pCVar1->G_acc).m_data[0] + (peVar3->UserForce).m_data[0];
      local_68[1] = dVar16 * (pCVar1->G_acc).m_data[1] + *(double *)((long)&peVar3->UserForce + 8);
      local_68[2] = dVar16 * (pCVar1->G_acc).m_data[2] +
                    *(double *)((long)&peVar3->UserForce + 0x10);
      p_Var15 = psVar8[uVar10].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      if (peVar3 == (element_type *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                      ,0x1a6,
                      "virtual void chrono::ChMatterSPH::IntLoadResidual_F(const unsigned int, ChVectorDynamic<> &, const double)"
                     );
      }
      uVar14 = (ulong)((int)uVar10 * 3 + off);
      if ((local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows + -3 < (long)uVar14) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar4 = (local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar11 = 3;
      if ((((ulong)(pdVar4 + uVar14) & 7) == 0) &&
         (uVar11 = (ulong)(-((uint)((ulong)(pdVar4 + uVar14) >> 3) & 0x1fffffff) & 7), 2 < uVar11))
      {
        uVar11 = 3;
      }
      if (uVar11 != 0) {
        uVar14 = 0;
        do {
          pdVar4[uVar13 + uVar14] = local_40 * local_68[uVar14] + pdVar4[uVar13 + uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      if (uVar11 < 3) {
        do {
          pdVar4[uVar13 + uVar11] = local_40 * local_68[uVar11] + pdVar4[uVar13 + uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
      uVar10 = (ulong)((int)uVar10 + 1);
      psVar8 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 3;
    } while (uVar10 < (ulong)((long)(this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    return;
  }
  return;
}

Assistant:

void ChMatterSPH::IntLoadResidual_F(
    const unsigned int off,  // offset in R residual (not used here! use particle's offsets)
    ChVectorDynamic<>& R,    // result: the R residual, R += c*F
    const double c           // a scaling factor
) {
    // COMPUTE THE SPH FORCES HERE

    // First, find if any ChProximityContainerSPH object is present
    // in the system,

    std::shared_ptr<ChProximityContainerSPH> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerSPH>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterSPH, you must add also a ChProximityContainerSPH.
    if (!edges)
        return;

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of particles's density

    edges->AccumulateStep1();

    // 3- Per-node volume and pressure computation

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // node pressure = k(dens - dens_0);
        mnode->pressure = material.Get_pressure_stiffness() * (mnode->density - material.Get_density());
    }

    // 4- Per-edge forces computation and accumulation

    edges->AccumulateStep2();

    // 5- Per-node load forces

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        // downcast
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        R.segment(off + 3 * j, 3) += c * TotForce.eigen();
    }
}